

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2AttributeInternal(void *ctx,xmlChar *fullname,xmlChar *value,xmlChar *prefix)

{
  int iVar1;
  uint uVar2;
  xmlURIPtr pxVar3;
  xmlNsPtr pxVar4;
  xmlNodePtr pxVar5;
  xmlChar *pxVar6;
  xmlChar *nvalnorm;
  xmlChar *val_2;
  xmlNodePtr tmp;
  xmlAttrPtr prop;
  xmlURIPtr uri_1;
  xmlChar *val_1;
  xmlNsPtr nsret_1;
  xmlURIPtr uri;
  xmlChar *val;
  xmlNsPtr nsret;
  xmlNsPtr namespace;
  xmlChar *nval;
  xmlChar *ns;
  xmlChar *name;
  xmlAttrPtr ret;
  xmlParserCtxtPtr ctxt;
  xmlChar *prefix_local;
  xmlChar *value_local;
  xmlChar *fullname_local;
  void *ctx_local;
  
  ret = (xmlAttrPtr)ctx;
  ctxt = (xmlParserCtxtPtr)prefix;
  prefix_local = value;
  value_local = fullname;
  fullname_local = (xmlChar *)ctx;
  if (*(int *)((long)ctx + 0x34) == 0) {
    ns = xmlSplitQName((xmlParserCtxtPtr)ctx,fullname,&nval);
    if ((ns != (xmlChar *)0x0) && (*ns == '\0')) {
      iVar1 = xmlStrEqual(nval,"xmlns");
      if (iVar1 == 0) {
        xmlNsWarnMsg((xmlParserCtxtPtr)ret,XML_WAR_NS_COLUMN,
                     "Avoid attribute ending with \':\' like \'%s\'\n",value_local,(xmlChar *)0x0);
      }
      else {
        xmlNsErrMsg((xmlParserCtxtPtr)ret,XML_ERR_NS_DECL_ERROR,
                    "invalid namespace declaration \'%s\'\n",value_local,(xmlChar *)0x0);
      }
      if (nval != (xmlChar *)0x0) {
        (*xmlFree)(nval);
      }
      nval = (xmlChar *)0x0;
      (*xmlFree)(ns);
      ns = xmlStrdup(value_local);
    }
  }
  else {
    ns = xmlStrdup(fullname);
    nval = (xmlChar *)0x0;
  }
  if (ns == (xmlChar *)0x0) {
    xmlSAX2ErrMemory((xmlParserCtxtPtr)ret,"xmlSAX2StartElement");
    if (nval != (xmlChar *)0x0) {
      (*xmlFree)(nval);
    }
  }
  else {
    if (((*(int *)((long)&ret->next + 4) == 0) || (prefix_local != (xmlChar *)0x0)) ||
       (iVar1 = htmlIsBooleanAttr(value_local), iVar1 == 0)) {
      *(undefined4 *)&ret[2].last = 1;
      namespace = (xmlNsPtr)
                  xmlValidCtxtNormalizeAttributeValue
                            ((xmlValidCtxtPtr)&ret[1].doc,(xmlDocPtr)ret->name,
                             *(xmlNodePtr *)&ret->atype,value_local,prefix_local);
      if (*(int *)&ret[2].last != 1) {
        *(undefined4 *)&ret[1].prev = 0;
      }
      if (namespace != (xmlNsPtr)0x0) {
        prefix_local = (xmlChar *)namespace;
      }
    }
    else {
      namespace = (xmlNsPtr)xmlStrdup(value_local);
      prefix_local = (xmlChar *)namespace;
    }
    if ((((*(int *)((long)&ret->next + 4) == 0) && (nval == (xmlChar *)0x0)) &&
        ((*ns == 'x' && ((ns[1] == 'm' && (ns[2] == 'l')))))) &&
       ((ns[3] == 'n' && ((ns[4] == 's' && (ns[5] == '\0')))))) {
      if (*(int *)((long)&ret->children + 4) == 0) {
        ret[4].type = ret[4].type + XML_ELEMENT_NODE;
        uri = (xmlURIPtr)
              xmlStringDecodeEntities((xmlParserCtxtPtr)ret,prefix_local,1,'\0','\0','\0');
        ret[4].type = ret[4].type - XML_ELEMENT_NODE;
        if (uri == (xmlURIPtr)0x0) {
          xmlSAX2ErrMemory((xmlParserCtxtPtr)ret,"xmlSAX2StartElement");
          if (ns != (xmlChar *)0x0) {
            (*xmlFree)(ns);
          }
          if (namespace == (xmlNsPtr)0x0) {
            return;
          }
          (*xmlFree)(namespace);
          return;
        }
      }
      else {
        uri = (xmlURIPtr)prefix_local;
      }
      if (*(char *)&uri->scheme != '\0') {
        pxVar3 = xmlParseURI((char *)uri);
        if (pxVar3 == (xmlURIPtr)0x0) {
          if ((ret->_private != (void *)0x0) && (*(long *)((long)ret->_private + 0xa8) != 0)) {
            (**(code **)((long)ret->_private + 0xa8))
                      (*(undefined8 *)&ret->type,"xmlns: %s not a valid URI\n",uri);
          }
        }
        else {
          if (((pxVar3->scheme == (char *)0x0) && (ret->_private != (void *)0x0)) &&
             (*(long *)((long)ret->_private + 0xa8) != 0)) {
            (**(code **)((long)ret->_private + 0xa8))
                      (*(undefined8 *)&ret->type,"xmlns: URI %s is not absolute\n",uri);
          }
          xmlFreeURI(pxVar3);
        }
      }
      pxVar4 = xmlNewNs(*(xmlNodePtr *)&ret->atype,(xmlChar *)uri,(xmlChar *)0x0);
      if ((((pxVar4 != (xmlNsPtr)0x0) && (*(int *)((long)&ret[1].prev + 4) != 0)) &&
          (*(int *)&ret->children != 0)) &&
         ((ret->name != (xmlChar *)0x0 && (*(long *)(ret->name + 0x50) != 0)))) {
        uVar2 = xmlValidateOneNamespace
                          ((xmlValidCtxtPtr)&ret[1].doc,(xmlDocPtr)ret->name,
                           *(xmlNodePtr *)&ret->atype,(xmlChar *)ctxt,pxVar4,(xmlChar *)uri);
        *(uint *)&ret[1].prev = uVar2 & *(uint *)&ret[1].prev;
      }
      if (ns != (xmlChar *)0x0) {
        (*xmlFree)(ns);
      }
      if (namespace != (xmlNsPtr)0x0) {
        (*xmlFree)(namespace);
      }
      if (uri != (xmlURIPtr)prefix_local) {
        (*xmlFree)(uri);
      }
    }
    else if ((((*(int *)((long)&ret->next + 4) == 0) &&
              ((((nval != (xmlChar *)0x0 && (*nval == 'x')) && (nval[1] == 'm')) &&
               ((nval[2] == 'l' && (nval[3] == 'n')))))) && (nval[4] == 's')) && (nval[5] == '\0'))
    {
      if (*(int *)((long)&ret->children + 4) == 0) {
        ret[4].type = ret[4].type + XML_ELEMENT_NODE;
        uri_1 = (xmlURIPtr)
                xmlStringDecodeEntities((xmlParserCtxtPtr)ret,prefix_local,1,'\0','\0','\0');
        ret[4].type = ret[4].type - XML_ELEMENT_NODE;
        if (uri_1 == (xmlURIPtr)0x0) {
          xmlSAX2ErrMemory((xmlParserCtxtPtr)ret,"xmlSAX2StartElement");
          (*xmlFree)(nval);
          if (ns != (xmlChar *)0x0) {
            (*xmlFree)(ns);
          }
          if (namespace == (xmlNsPtr)0x0) {
            return;
          }
          (*xmlFree)(namespace);
          return;
        }
      }
      else {
        uri_1 = (xmlURIPtr)prefix_local;
      }
      if (*(char *)&uri_1->scheme == '\0') {
        xmlNsErrMsg((xmlParserCtxtPtr)ret,XML_NS_ERR_EMPTY,"Empty namespace name for prefix %s\n",ns
                    ,(xmlChar *)0x0);
      }
      if ((*(int *)((long)&ret[4].last + 4) != 0) && (*(char *)&uri_1->scheme != '\0')) {
        pxVar3 = xmlParseURI((char *)uri_1);
        if (pxVar3 == (xmlURIPtr)0x0) {
          xmlNsWarnMsg((xmlParserCtxtPtr)ret,XML_WAR_NS_URI,"xmlns:%s: %s not a valid URI\n",ns,
                       prefix_local);
        }
        else {
          if (pxVar3->scheme == (char *)0x0) {
            xmlNsWarnMsg((xmlParserCtxtPtr)ret,XML_WAR_NS_URI_RELATIVE,
                         "xmlns:%s: URI %s is not absolute\n",ns,prefix_local);
          }
          xmlFreeURI(pxVar3);
        }
      }
      pxVar4 = xmlNewNs(*(xmlNodePtr *)&ret->atype,(xmlChar *)uri_1,ns);
      (*xmlFree)(nval);
      if ((((pxVar4 != (xmlNsPtr)0x0) && (*(int *)((long)&ret[1].prev + 4) != 0)) &&
          (*(int *)&ret->children != 0)) &&
         ((ret->name != (xmlChar *)0x0 && (*(long *)(ret->name + 0x50) != 0)))) {
        uVar2 = xmlValidateOneNamespace
                          ((xmlValidCtxtPtr)&ret[1].doc,(xmlDocPtr)ret->name,
                           *(xmlNodePtr *)&ret->atype,(xmlChar *)ctxt,pxVar4,prefix_local);
        *(uint *)&ret[1].prev = uVar2 & *(uint *)&ret[1].prev;
      }
      if (ns != (xmlChar *)0x0) {
        (*xmlFree)(ns);
      }
      if (namespace != (xmlNsPtr)0x0) {
        (*xmlFree)(namespace);
      }
      if (uri_1 != (xmlURIPtr)prefix_local) {
        (*xmlFree)(uri_1);
      }
    }
    else {
      if (nval == (xmlChar *)0x0) {
        nsret = (xmlNsPtr)0x0;
      }
      else {
        nsret = xmlSearchNs((xmlDocPtr)ret->name,*(xmlNodePtr *)&ret->atype,nval);
        if (nsret == (xmlNsPtr)0x0) {
          xmlNsErrMsg((xmlParserCtxtPtr)ret,XML_NS_ERR_UNDEFINED_NAMESPACE,
                      "Namespace prefix %s of attribute %s is not defined\n",nval,ns);
        }
        else {
          for (tmp = *(xmlNodePtr *)(*(long *)&ret->atype + 0x58); tmp != (xmlNodePtr)0x0;
              tmp = tmp->next) {
            if (((tmp->ns != (xmlNs *)0x0) && (iVar1 = xmlStrEqual(ns,tmp->name), iVar1 != 0)) &&
               ((nsret == tmp->ns || (iVar1 = xmlStrEqual(nsret->href,tmp->ns->href), iVar1 != 0))))
            {
              xmlNsErrMsg((xmlParserCtxtPtr)ret,XML_ERR_ATTRIBUTE_REDEFINED,
                          "Attribute %s in %s redefined\n",ns,nsret->href);
              *(undefined4 *)&ret->children = 0;
              if (*(int *)&ret[4].doc == 0) {
                *(undefined4 *)((long)&ret[3].parent + 4) = 1;
              }
              if (ns != (xmlChar *)0x0) {
                (*xmlFree)(ns);
              }
              goto LAB_001ba36c;
            }
          }
        }
      }
      name = (xmlChar *)xmlNewNsPropEatName(*(xmlNodePtr *)&ret->atype,nsret,ns,(xmlChar *)0x0);
      if ((xmlAttrPtr)name != (xmlAttrPtr)0x0) {
        if ((*(int *)((long)&ret->children + 4) == 0) && (*(int *)((long)&ret->next + 4) == 0)) {
          pxVar5 = xmlStringGetNodeList((xmlDoc *)ret->name,prefix_local);
          *(xmlNodePtr *)(name + 0x18) = pxVar5;
          for (val_2 = *(xmlChar **)(name + 0x18); val_2 != (xmlChar *)0x0;
              val_2 = *(xmlChar **)(val_2 + 0x30)) {
            *(xmlChar **)(val_2 + 0x28) = name;
            if (*(long *)(val_2 + 0x30) == 0) {
              *(xmlChar **)(name + 0x20) = val_2;
            }
          }
        }
        else if (prefix_local != (xmlChar *)0x0) {
          pxVar5 = xmlNewDocText((xmlDoc *)ret->name,prefix_local);
          *(xmlNodePtr *)(name + 0x18) = pxVar5;
          *(undefined8 *)(name + 0x20) = *(undefined8 *)(name + 0x18);
          if (*(long *)(name + 0x18) != 0) {
            *(xmlChar **)(*(long *)(name + 0x18) + 0x28) = name;
          }
        }
      }
      if ((((*(int *)((long)&ret->next + 4) == 0) && (*(int *)((long)&ret[1].prev + 4) != 0)) &&
          (*(int *)&ret->children != 0)) &&
         ((ret->name != (xmlChar *)0x0 && (*(long *)(ret->name + 0x50) != 0)))) {
        if (*(int *)((long)&ret->children + 4) == 0) {
          ret[4].type = ret[4].type + XML_ELEMENT_NODE;
          nvalnorm = xmlStringDecodeEntities((xmlParserCtxtPtr)ret,prefix_local,1,'\0','\0','\0');
          ret[4].type = ret[4].type - XML_ELEMENT_NODE;
          if (nvalnorm == (xmlChar *)0x0) {
            uVar2 = xmlValidateOneAttribute
                              ((xmlValidCtxtPtr)&ret[1].doc,(xmlDocPtr)ret->name,
                               *(xmlNodePtr *)&ret->atype,(xmlAttrPtr)name,prefix_local);
            *(uint *)&ret[1].prev = uVar2 & *(uint *)&ret[1].prev;
          }
          else {
            pxVar6 = xmlValidNormalizeAttributeValue
                               ((xmlDocPtr)ret->name,*(xmlNodePtr *)&ret->atype,value_local,nvalnorm
                               );
            if (pxVar6 != (xmlChar *)0x0) {
              (*xmlFree)(nvalnorm);
              nvalnorm = pxVar6;
            }
            uVar2 = xmlValidateOneAttribute
                              ((xmlValidCtxtPtr)&ret[1].doc,(xmlDocPtr)ret->name,
                               *(xmlNodePtr *)&ret->atype,(xmlAttrPtr)name,nvalnorm);
            *(uint *)&ret[1].prev = uVar2 & *(uint *)&ret[1].prev;
            (*xmlFree)(nvalnorm);
          }
        }
        else {
          uVar2 = xmlValidateOneAttribute
                            ((xmlValidCtxtPtr)&ret[1].doc,(xmlDocPtr)ret->name,
                             *(xmlNodePtr *)&ret->atype,(xmlAttrPtr)name,prefix_local);
          *(uint *)&ret[1].prev = uVar2 & *(uint *)&ret[1].prev;
        }
      }
      else if ((((ulong)ret[4].next & 8) == 0) &&
              (((*(int *)((long)&ret->children + 4) == 0 && (*(int *)((long)&ret[1].next + 4) != 2))
               || ((*(int *)((long)&ret->children + 4) != 0 && (*(int *)&ret[3].next == 0)))))) {
        iVar1 = xmlStrEqual(value_local,(xmlChar *)"xml:id");
        if (iVar1 == 0) {
          iVar1 = xmlIsID((xmlDocPtr)ret->name,*(xmlNodePtr *)&ret->atype,(xmlAttrPtr)name);
          if (iVar1 == 0) {
            iVar1 = xmlIsRef((xmlDocPtr)ret->name,*(xmlNodePtr *)&ret->atype,(xmlAttrPtr)name);
            if (iVar1 != 0) {
              xmlAddRef((xmlValidCtxtPtr)&ret[1].doc,(xmlDocPtr)ret->name,prefix_local,
                        (xmlAttrPtr)name);
            }
          }
          else {
            xmlAddID((xmlValidCtxtPtr)&ret[1].doc,(xmlDocPtr)ret->name,prefix_local,(xmlAttrPtr)name
                    );
          }
        }
        else {
          iVar1 = xmlValidateNCName(prefix_local,1);
          if (iVar1 != 0) {
            xmlErrValid((xmlParserCtxtPtr)ret,XML_DTD_XMLID_VALUE,
                        "xml:id : attribute value %s is not an NCName\n",(char *)prefix_local,
                        (char *)0x0);
          }
          xmlAddID((xmlValidCtxtPtr)&ret[1].doc,(xmlDocPtr)ret->name,prefix_local,(xmlAttrPtr)name);
        }
      }
LAB_001ba36c:
      if (namespace != (xmlNsPtr)0x0) {
        (*xmlFree)(namespace);
      }
      if (nval != (xmlChar *)0x0) {
        (*xmlFree)(nval);
      }
    }
  }
  return;
}

Assistant:

static void
xmlSAX2AttributeInternal(void *ctx, const xmlChar *fullname,
             const xmlChar *value, const xmlChar *prefix ATTRIBUTE_UNUSED)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlAttrPtr ret;
    xmlChar *name;
    xmlChar *ns;
    xmlChar *nval;
    xmlNsPtr namespace;

    if (ctxt->html) {
	name = xmlStrdup(fullname);
	ns = NULL;
	namespace = NULL;
    } else {
	/*
	 * Split the full name into a namespace prefix and the tag name
	 */
	name = xmlSplitQName(ctxt, fullname, &ns);
	if ((name != NULL) && (name[0] == 0)) {
	    if (xmlStrEqual(ns, BAD_CAST "xmlns")) {
		xmlNsErrMsg(ctxt, XML_ERR_NS_DECL_ERROR,
			    "invalid namespace declaration '%s'\n",
			    fullname, NULL);
	    } else {
		xmlNsWarnMsg(ctxt, XML_WAR_NS_COLUMN,
			     "Avoid attribute ending with ':' like '%s'\n",
			     fullname, NULL);
	    }
	    if (ns != NULL)
		xmlFree(ns);
	    ns = NULL;
	    xmlFree(name);
	    name = xmlStrdup(fullname);
	}
    }
    if (name == NULL) {
        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElement");
	if (ns != NULL)
	    xmlFree(ns);
	return;
    }

#ifdef LIBXML_HTML_ENABLED
    if ((ctxt->html) &&
        (value == NULL) && (htmlIsBooleanAttr(fullname))) {
            nval = xmlStrdup(fullname);
            value = (const xmlChar *) nval;
    } else
#endif
    {
#ifdef LIBXML_VALID_ENABLED
        /*
         * Do the last stage of the attribute normalization
         * Needed for HTML too:
         *   http://www.w3.org/TR/html4/types.html#h-6.2
         */
        ctxt->vctxt.valid = 1;
        nval = xmlValidCtxtNormalizeAttributeValue(&ctxt->vctxt,
                                               ctxt->myDoc, ctxt->node,
                                               fullname, value);
        if (ctxt->vctxt.valid != 1) {
            ctxt->valid = 0;
        }
        if (nval != NULL)
            value = nval;
#else
        nval = NULL;
#endif /* LIBXML_VALID_ENABLED */
    }

    /*
     * Check whether it's a namespace definition
     */
    if ((!ctxt->html) && (ns == NULL) &&
        (name[0] == 'x') && (name[1] == 'm') && (name[2] == 'l') &&
        (name[3] == 'n') && (name[4] == 's') && (name[5] == 0)) {
	xmlNsPtr nsret;
	xmlChar *val;

        if (!ctxt->replaceEntities) {
	    ctxt->depth++;
	    val = xmlStringDecodeEntities(ctxt, value, XML_SUBSTITUTE_REF,
		                          0,0,0);
	    ctxt->depth--;
	    if (val == NULL) {
	        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElement");
		if (name != NULL)
		    xmlFree(name);
                if (nval != NULL)
                    xmlFree(nval);
		return;
	    }
	} else {
	    val = (xmlChar *) value;
	}

	if (val[0] != 0) {
	    xmlURIPtr uri;

	    uri = xmlParseURI((const char *)val);
	    if (uri == NULL) {
		if ((ctxt->sax != NULL) && (ctxt->sax->warning != NULL))
		    ctxt->sax->warning(ctxt->userData,
			 "xmlns: %s not a valid URI\n", val);
	    } else {
		if (uri->scheme == NULL) {
		    if ((ctxt->sax != NULL) && (ctxt->sax->warning != NULL))
			ctxt->sax->warning(ctxt->userData,
			     "xmlns: URI %s is not absolute\n", val);
		}
		xmlFreeURI(uri);
	    }
	}

	/* a default namespace definition */
	nsret = xmlNewNs(ctxt->node, val, NULL);

#ifdef LIBXML_VALID_ENABLED
	/*
	 * Validate also for namespace decls, they are attributes from
	 * an XML-1.0 perspective
	 */
        if (nsret != NULL && ctxt->validate && ctxt->wellFormed &&
	    ctxt->myDoc && ctxt->myDoc->intSubset)
	    ctxt->valid &= xmlValidateOneNamespace(&ctxt->vctxt, ctxt->myDoc,
					   ctxt->node, prefix, nsret, val);
#endif /* LIBXML_VALID_ENABLED */
	if (name != NULL)
	    xmlFree(name);
	if (nval != NULL)
	    xmlFree(nval);
	if (val != value)
	    xmlFree(val);
	return;
    }
    if ((!ctxt->html) &&
	(ns != NULL) && (ns[0] == 'x') && (ns[1] == 'm') && (ns[2] == 'l') &&
        (ns[3] == 'n') && (ns[4] == 's') && (ns[5] == 0)) {
	xmlNsPtr nsret;
	xmlChar *val;

        if (!ctxt->replaceEntities) {
	    ctxt->depth++;
	    val = xmlStringDecodeEntities(ctxt, value, XML_SUBSTITUTE_REF,
		                          0,0,0);
	    ctxt->depth--;
	    if (val == NULL) {
	        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElement");
	        xmlFree(ns);
		if (name != NULL)
		    xmlFree(name);
                if (nval != NULL)
                    xmlFree(nval);
		return;
	    }
	} else {
	    val = (xmlChar *) value;
	}

	if (val[0] == 0) {
	    xmlNsErrMsg(ctxt, XML_NS_ERR_EMPTY,
		        "Empty namespace name for prefix %s\n", name, NULL);
	}
	if ((ctxt->pedantic != 0) && (val[0] != 0)) {
	    xmlURIPtr uri;

	    uri = xmlParseURI((const char *)val);
	    if (uri == NULL) {
	        xmlNsWarnMsg(ctxt, XML_WAR_NS_URI,
			 "xmlns:%s: %s not a valid URI\n", name, value);
	    } else {
		if (uri->scheme == NULL) {
		    xmlNsWarnMsg(ctxt, XML_WAR_NS_URI_RELATIVE,
			   "xmlns:%s: URI %s is not absolute\n", name, value);
		}
		xmlFreeURI(uri);
	    }
	}

	/* a standard namespace definition */
	nsret = xmlNewNs(ctxt->node, val, name);
	xmlFree(ns);
#ifdef LIBXML_VALID_ENABLED
	/*
	 * Validate also for namespace decls, they are attributes from
	 * an XML-1.0 perspective
	 */
        if (nsret != NULL && ctxt->validate && ctxt->wellFormed &&
	    ctxt->myDoc && ctxt->myDoc->intSubset)
	    ctxt->valid &= xmlValidateOneNamespace(&ctxt->vctxt, ctxt->myDoc,
					   ctxt->node, prefix, nsret, value);
#endif /* LIBXML_VALID_ENABLED */
	if (name != NULL)
	    xmlFree(name);
	if (nval != NULL)
	    xmlFree(nval);
	if (val != value)
	    xmlFree(val);
	return;
    }

    if (ns != NULL) {
	namespace = xmlSearchNs(ctxt->myDoc, ctxt->node, ns);

	if (namespace == NULL) {
	    xmlNsErrMsg(ctxt, XML_NS_ERR_UNDEFINED_NAMESPACE,
		    "Namespace prefix %s of attribute %s is not defined\n",
		             ns, name);
	} else {
            xmlAttrPtr prop;

            prop = ctxt->node->properties;
            while (prop != NULL) {
                if (prop->ns != NULL) {
                    if ((xmlStrEqual(name, prop->name)) &&
                        ((namespace == prop->ns) ||
                         (xmlStrEqual(namespace->href, prop->ns->href)))) {
                            xmlNsErrMsg(ctxt, XML_ERR_ATTRIBUTE_REDEFINED,
                                    "Attribute %s in %s redefined\n",
                                             name, namespace->href);
                        ctxt->wellFormed = 0;
                        if (ctxt->recovery == 0) ctxt->disableSAX = 1;
                        if (name != NULL)
                            xmlFree(name);
                        goto error;
                    }
                }
                prop = prop->next;
            }
        }
    } else {
	namespace = NULL;
    }

    /* !!!!!! <a toto:arg="" xmlns:toto="http://toto.com"> */
    ret = xmlNewNsPropEatName(ctxt->node, namespace, name, NULL);

    if (ret != NULL) {
        if ((ctxt->replaceEntities == 0) && (!ctxt->html)) {
	    xmlNodePtr tmp;

	    ret->children = xmlStringGetNodeList(ctxt->myDoc, value);
	    tmp = ret->children;
	    while (tmp != NULL) {
		tmp->parent = (xmlNodePtr) ret;
		if (tmp->next == NULL)
		    ret->last = tmp;
		tmp = tmp->next;
	    }
	} else if (value != NULL) {
	    ret->children = xmlNewDocText(ctxt->myDoc, value);
	    ret->last = ret->children;
	    if (ret->children != NULL)
		ret->children->parent = (xmlNodePtr) ret;
	}
    }

#ifdef LIBXML_VALID_ENABLED
    if ((!ctxt->html) && ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset) {

	/*
	 * If we don't substitute entities, the validation should be
	 * done on a value with replaced entities anyway.
	 */
        if (!ctxt->replaceEntities) {
	    xmlChar *val;

	    ctxt->depth++;
	    val = xmlStringDecodeEntities(ctxt, value, XML_SUBSTITUTE_REF,
		                          0,0,0);
	    ctxt->depth--;

	    if (val == NULL)
		ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
				ctxt->myDoc, ctxt->node, ret, value);
	    else {
		xmlChar *nvalnorm;

		/*
		 * Do the last stage of the attribute normalization
		 * It need to be done twice ... it's an extra burden related
		 * to the ability to keep xmlSAX2References in attributes
		 */
		nvalnorm = xmlValidNormalizeAttributeValue(ctxt->myDoc,
					    ctxt->node, fullname, val);
		if (nvalnorm != NULL) {
		    xmlFree(val);
		    val = nvalnorm;
		}

		ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
			        ctxt->myDoc, ctxt->node, ret, val);
                xmlFree(val);
	    }
	} else {
	    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt, ctxt->myDoc,
					       ctxt->node, ret, value);
	}
    } else
#endif /* LIBXML_VALID_ENABLED */
           if (((ctxt->loadsubset & XML_SKIP_IDS) == 0) &&
	       (((ctxt->replaceEntities == 0) && (ctxt->external != 2)) ||
	        ((ctxt->replaceEntities != 0) && (ctxt->inSubset == 0)))) {
        /*
	 * when validating, the ID registration is done at the attribute
	 * validation level. Otherwise we have to do specific handling here.
	 */
	if (xmlStrEqual(fullname, BAD_CAST "xml:id")) {
	    /*
	     * Add the xml:id value
	     *
	     * Open issue: normalization of the value.
	     */
	    if (xmlValidateNCName(value, 1) != 0) {
	        xmlErrValid(ctxt, XML_DTD_XMLID_VALUE,
		      "xml:id : attribute value %s is not an NCName\n",
			    (const char *) value, NULL);
	    }
	    xmlAddID(&ctxt->vctxt, ctxt->myDoc, value, ret);
	} else if (xmlIsID(ctxt->myDoc, ctxt->node, ret))
	    xmlAddID(&ctxt->vctxt, ctxt->myDoc, value, ret);
	else if (xmlIsRef(ctxt->myDoc, ctxt->node, ret))
	    xmlAddRef(&ctxt->vctxt, ctxt->myDoc, value, ret);
    }

error:
    if (nval != NULL)
	xmlFree(nval);
    if (ns != NULL)
	xmlFree(ns);
}